

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float x0;
  float y0;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ImFont *pIVar7;
  uint uVar8;
  int iVar9;
  int off_y_1;
  long lVar10;
  uchar *puVar11;
  uint *puVar12;
  int off_x;
  ulong uVar13;
  ImFontAtlasCustomRect *pIVar14;
  uint uVar15;
  char *pcVar16;
  uint *puVar17;
  int off_y;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int off_y_2;
  int off_x_2;
  uint uVar21;
  long lVar22;
  int iVar23;
  size_t __n;
  float fVar24;
  int local_74;
  size_t local_50;
  
  iVar9 = atlas->PackIdMouseCursors;
  pIVar14 = (atlas->CustomRects).Data;
  lVar10 = (long)atlas->TexWidth;
  uVar20 = (ulong)pIVar14[iVar9].X;
  if ((atlas->Flags & 2) == 0) {
    uVar13 = (ulong)pIVar14[iVar9].Y;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar17 = atlas->TexPixelsRGBA32;
      puVar12 = puVar17 + (ulong)pIVar14[iVar9].X + lVar10 * uVar13;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar10 = 0;
        do {
          puVar12[lVar10] = -(uint)(pcVar16[lVar10] == '.');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
      puVar17 = puVar17 + uVar20 + 0x7b + (long)atlas->TexWidth * uVar13;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar10 = 0;
        do {
          puVar17[lVar10] = -(uint)(pcVar16[lVar10] == 'X');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar17 = puVar17 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
    }
    else {
      puVar11 = atlas->TexPixelsAlpha8 + lVar10 * uVar13 + uVar20;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar10 = 0;
        do {
          puVar11[lVar10] = -(pcVar16[lVar10] == '.');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar11 = puVar11 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
      puVar11 = atlas->TexPixelsAlpha8 +
                (long)atlas->TexWidth * (ulong)pIVar14[iVar9].Y + uVar20 + 0x7b;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar10 = 0;
        do {
          puVar11[lVar10] = -(pcVar16[lVar10] == 'X');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar11 = puVar11 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
    }
  }
  else {
    lVar22 = (ulong)pIVar14[iVar9].Y * lVar10 + uVar20;
    iVar18 = (int)lVar22;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar17 = atlas->TexPixelsRGBA32;
      puVar12 = puVar17 + (atlas->TexWidth + iVar18);
      puVar12[0] = 0xffffffff;
      puVar12[1] = 0xffffffff;
      puVar17 = puVar17 + iVar18;
      puVar17[0] = 0xffffffff;
      puVar17[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[iVar18 + lVar10 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar18 + lVar10] = 0xff;
      atlas->TexPixelsAlpha8[lVar22 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar22] = 0xff;
    }
  }
  uVar8._0_2_ = pIVar14[iVar9].X;
  uVar8._2_2_ = pIVar14[iVar9].Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar8 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar8 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar14 = (atlas->CustomRects).Data + atlas->PackIdLines;
    local_50 = 0;
    lVar10 = -0x40;
    local_74 = 0;
    iVar9 = 0;
    do {
      uVar3 = pIVar14->Width;
      uVar8 = iVar9 + (uint)uVar3;
      uVar21 = uVar8 >> 1;
      iVar18 = (int)lVar10;
      uVar15 = uVar21 + 0x40 + iVar18;
      iVar23 = (uVar3 - uVar21) + iVar9;
      puVar11 = atlas->TexPixelsAlpha8;
      if (puVar11 == (uchar *)0x0) {
        puVar17 = atlas->TexPixelsRGBA32;
        uVar4 = pIVar14->X;
        uVar5 = pIVar14->Y;
        iVar6 = atlas->TexWidth;
        puVar12 = puVar17 + (((uint)uVar5 + iVar18 + 0x40) * iVar6 + (uint)uVar4);
        if (1 < uVar8) {
          memset(puVar12,0,(ulong)(uVar21 + (uVar21 == 0)) << 2);
        }
        if (lVar10 != -0x40) {
          memset(puVar12 + uVar21,0xff,local_50);
        }
        if (uVar15 != uVar3) {
          puVar17 = puVar17 + (ulong)uVar21 +
                              (ulong)(iVar6 * ((uint)uVar5 + local_74) + (uint)uVar4) +
                              lVar10 + 0x40;
          __n = (ulong)(iVar23 + (uint)(iVar23 == 0)) << 2;
          goto LAB_00134c2b;
        }
      }
      else {
        uVar4 = pIVar14->X;
        uVar5 = pIVar14->Y;
        iVar6 = atlas->TexWidth;
        if (1 < uVar8) {
          memset(puVar11 + (((uint)uVar5 + iVar18 + 0x40) * iVar6 + (uint)uVar4),0,
                 (ulong)(uVar21 + (uVar21 == 0)));
        }
        if (lVar10 != -0x40) {
          memset(puVar11 + (((uint)uVar5 + iVar18 + 0x40) * iVar6 + (uint)uVar4) + uVar21,0xff,
                 lVar10 + 0x40);
        }
        if (uVar15 != uVar3) {
          puVar17 = (uint *)(puVar11 +
                            lVar10 + (ulong)(iVar6 * ((uint)uVar5 + local_74) + (uint)uVar4) +
                                     (ulong)uVar21 + 0x40);
          __n = (size_t)(iVar23 + (uint)(iVar23 == 0));
LAB_00134c2b:
          memset(puVar17,0,__n);
        }
      }
      uVar3 = pIVar14->X;
      uVar4 = pIVar14->Y;
      fVar1 = (atlas->TexUvScale).x;
      fVar24 = (atlas->TexUvScale).y;
      (&atlas->TexUvLines[0].x)[local_50] = (float)((uVar3 + uVar21) - 1) * fVar1;
      fVar24 = ((float)(int)(iVar18 + 0x41 + (uint)uVar4) * fVar24 +
               (float)(int)(iVar18 + 0x40 + (uint)uVar4) * fVar24) * 0.5;
      *(ulong *)(&atlas->TexUvLines[0].y + local_50) =
           CONCAT44(fVar1 * (float)(iVar18 + 0x41 + uVar21 + uVar3),fVar24);
      (&atlas->TexUvLines[0].w)[local_50] = fVar24;
      iVar9 = iVar9 + -1;
      local_74 = local_74 + 1;
      local_50 = local_50 + 4;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar10 = 0;
    lVar22 = 0;
    do {
      pIVar14 = (atlas->CustomRects).Data;
      pIVar7 = *(ImFont **)((long)&pIVar14->Font + lVar10);
      if ((pIVar7 != (ImFont *)0x0) &&
         (iVar9 = *(int *)((long)&pIVar14->GlyphID + lVar10), iVar9 != 0)) {
        uVar8 = (uint)*(ushort *)((long)&pIVar14->X + lVar10);
        fVar1 = (atlas->TexUvScale).x;
        fVar24 = (atlas->TexUvScale).y;
        uVar21 = (uint)*(ushort *)((long)&pIVar14->Y + lVar10);
        uVar19 = (uint)*(ushort *)((long)&pIVar14->Width + lVar10);
        uVar15 = (uint)*(ushort *)((long)&pIVar14->Height + lVar10);
        x0 = *(float *)((long)&(pIVar14->GlyphOffset).x + lVar10);
        y0 = *(float *)((long)&(pIVar14->GlyphOffset).y + lVar10);
        ImFont::AddGlyph(pIVar7,(ImFontConfig *)0x0,(ImWchar)iVar9,x0,y0,(float)uVar19 + x0,
                         (float)uVar15 + y0,(float)uVar8 * fVar1,(float)uVar21 * fVar24,
                         (float)(uVar8 + uVar19) * fVar1,(float)(uVar21 + uVar15) * fVar24,
                         *(float *)((long)&pIVar14->GlyphAdvanceX + lVar10));
      }
      lVar22 = lVar22 + 1;
      lVar10 = lVar10 + 0x20;
    } while (lVar22 < (atlas->CustomRects).Size);
  }
  if (0 < (atlas->Fonts).Size) {
    lVar10 = 0;
    do {
      pIVar7 = (atlas->Fonts).Data[lVar10];
      if (pIVar7->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar7);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (atlas->Fonts).Size);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}